

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utl.cpp
# Opt level: O2

bool __thiscall utl::file_line_iterator::equal(file_line_iterator *this,file_line_iterator *other)

{
  element_type *peVar1;
  element_type *peVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  runtime_error *this_00;
  bool bVar6;
  string local_1c0 [32];
  stringstream ss;
  ostream local_190 [376];
  
  peVar1 = (this->is).px;
  peVar2 = (other->is).px;
  bVar6 = peVar1 == (element_type *)0x0 && peVar2 == (element_type *)0x0;
  if (peVar2 != (element_type *)0x0 && peVar1 != (element_type *)0x0) {
    if (peVar1 != peVar2) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar5 = std::operator<<(local_190,"Failed to ensure condition ");
      poVar5 = std::operator<<(poVar5,"is == other.is");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"at (");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/utl.cpp"
                              );
      poVar5 = std::operator<<(poVar5,",");
      poVar5 = std::operator<<(poVar5,"equal");
      poVar5 = std::operator<<(poVar5,",");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x49);
      poVar5 = std::operator<<(poVar5,") \n ");
      poVar5 = std::operator<<(poVar5,"Message : ");
      poVar5 = std::operator<<(poVar5,"\"cannot compare distinct istream iters\"");
      std::operator<<(poVar5,"\n");
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,local_1c0);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    boost::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>::operator->(&this->is);
    lVar3 = std::istream::tellg();
    boost::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>::operator->(&other->is);
    lVar4 = std::istream::tellg();
    bVar6 = lVar3 == lVar4;
  }
  return bVar6;
}

Assistant:

bool file_line_iterator::equal(file_line_iterator const& other) const
{
  if(!is && !other.is)
    return true;

  if(!is || !other.is)
    return false;

  ENSURE(is == other.is, "cannot compare distinct istream iters");

  return is->tellg() == other.is->tellg();
}